

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser.cpp
# Opt level: O2

unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> __thiscall
Parser::parseFunctionCall(Parser *this,optional<Token> *identifierToken)

{
  Mark MVar1;
  Mark *pMVar2;
  Token *pTVar3;
  variant_alternative_t<0UL,_variant<basic_string<char>,_double>_> *pvVar4;
  optional<Token> *in_RDX;
  _Head_base<0UL,_ExpressionNode_*,_false> _Var5;
  list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_> arguments
  ;
  string name;
  Token token;
  string sStack_108;
  Mark local_e8;
  unique_ptr<ExpressionNode,_std::default_delete<ExpressionNode>_> local_e0;
  undefined1 local_d8 [32];
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
  local_b8;
  Token local_a0;
  Token local_68;
  
  pMVar2 = Stream::getMark((Stream *)identifierToken);
  MVar1 = *pMVar2;
  local_d8._0_8_ = local_d8 + 0x10;
  local_d8._8_8_ = (_List_node_base *)0x0;
  local_d8[0x10] = 0;
  if ((in_RDX->super__Optional_base<Token,_false,_false>)._M_payload.
      super__Optional_payload<Token,_true,_false,_false>.super__Optional_payload_base<Token>.
      _M_engaged == true) {
    pTVar3 = std::optional<Token>::value(in_RDX);
    std::get<0ul,std::__cxx11::string,double>(&pTVar3->value);
    std::__cxx11::string::_M_assign((string *)local_d8);
  }
  else {
    pTVar3 = Tokenizer::peek((Tokenizer *)identifierToken);
    if (pTVar3->type - KeywordIf < 2) {
      pTVar3 = Tokenizer::peek((Tokenizer *)identifierToken);
      std::get<0ul,std::__cxx11::string,double>(&pTVar3->value);
      std::__cxx11::string::_M_assign((string *)local_d8);
      Tokenizer::nextToken(&local_68,(Tokenizer *)identifierToken);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_68.value);
    }
    else {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&sStack_108,"Expected function name!",(allocator<char> *)&local_b8);
      getToken(&local_a0,(Parser *)identifierToken,Identifier,&sStack_108);
      pvVar4 = std::get<0ul,std::__cxx11::string,double>(&local_a0.value);
      std::__cxx11::string::operator=((string *)local_d8,(string *)pvVar4);
      std::__detail::__variant::
      _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
      ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                           *)&local_a0.value);
      std::__cxx11::string::~string((string *)&sStack_108);
    }
  }
  parseCallArgumentList_abi_cxx11_
            ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)&sStack_108,(Parser *)identifierToken);
  local_e8 = MVar1;
  std::
  make_unique<FunctionCallNode,std::__cxx11::string&,std::__cxx11::list<std::shared_ptr<ExpressionNode>,std::allocator<std::shared_ptr<ExpressionNode>>>>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_a0,
             (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
              *)local_d8);
  _Var5._M_head_impl = (ExpressionNode *)CONCAT44(local_a0._4_4_,local_a0.type);
  (this->tokenizer_).stream_.is_ = (istream *)_Var5._M_head_impl;
  pTVar3 = Tokenizer::peek((Tokenizer *)identifierToken);
  Token::Token(&local_a0,pTVar3);
  while (local_a0.type == LParen) {
    parseCallArgumentList_abi_cxx11_
              ((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)&local_b8,(Parser *)identifierToken);
    std::__cxx11::
    list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
    _M_move_assign((list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                    *)&sStack_108,&local_b8);
    std::__cxx11::
    _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
    _M_clear(&local_b8);
    (this->tokenizer_).stream_.is_ = (istream *)0x0;
    local_b8._M_impl._M_node.super__List_node_base._M_next = (_List_node_base *)_Var5._M_head_impl;
    std::
    make_unique<FunctionResultCallNode,std::unique_ptr<ExpressionNode,std::default_delete<ExpressionNode>>,std::__cxx11::list<std::shared_ptr<ExpressionNode>,std::allocator<std::shared_ptr<ExpressionNode>>>>
              (&local_e0,
               (list<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
                *)&local_b8);
    _Var5._M_head_impl =
         (ExpressionNode *)
         local_e0._M_t.super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>.
         _M_t.super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
         super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
    (this->tokenizer_).stream_.is_ =
         (istream *)
         local_e0._M_t.super___uniq_ptr_impl<ExpressionNode,_std::default_delete<ExpressionNode>_>.
         _M_t.super__Tuple_impl<0UL,_ExpressionNode_*,_std::default_delete<ExpressionNode>_>.
         super__Head_base<0UL,_ExpressionNode_*,_false>._M_head_impl;
    pTVar3 = Tokenizer::peek((Tokenizer *)identifierToken);
    Token::operator=(&local_a0,pTVar3);
    if (local_b8._M_impl._M_node.super__List_node_base._M_next != (_List_node_base *)0x0) {
      (*(code *)(local_b8._M_impl._M_node.super__List_node_base._M_next)->_M_next->_M_prev)();
    }
  }
  ((_Var5._M_head_impl)->super_Node).mark_ = local_e8;
  std::__detail::__variant::
  _Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
  ::~_Variant_storage((_Variant_storage<false,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_double>
                       *)&local_a0.value);
  std::__cxx11::
  _List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>::
  _M_clear((_List_base<std::shared_ptr<ExpressionNode>,_std::allocator<std::shared_ptr<ExpressionNode>_>_>
            *)&sStack_108);
  std::__cxx11::string::~string((string *)local_d8);
  return (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)
         (__uniq_ptr_data<ExpressionNode,_std::default_delete<ExpressionNode>,_true,_true>)this;
}

Assistant:

std::unique_ptr<ExpressionNode> Parser::parseFunctionCall(std::optional<Token> identifierToken)
{
  const auto mark = tokenizer_.getMark();
  std::string name;
  if(identifierToken.has_value())
    name = std::get<std::string>(identifierToken.value().value);
  else if(Token::isSpecialFunction(tokenizer_.peek()))
  {
    name = std::get<std::string>(tokenizer_.peek().value);
    tokenizer_.nextToken();
  }
  else
    name = std::get<std::string>(getToken(TokenType::Identifier, "Expected function name!").value);
  
  auto arguments = parseCallArgumentList();
  std::unique_ptr<ExpressionNode> node = std::make_unique<FunctionCallNode>(name, std::move(arguments));

  auto token = tokenizer_.peek();
  while(token.type == TokenType::LParen)
  {
    arguments = parseCallArgumentList();
    auto func = std::move(node);
    node = std::make_unique<FunctionResultCallNode>(std::move(func), std::move(arguments));
    token = tokenizer_.peek();
  }

  node->setMark(mark);
  return node;
}